

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

uint8_t * Fossilize::decode_base64(ScratchAllocator *allocator,char *data,size_t length)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte *pbVar5;
  ulong uVar6;
  byte bVar7;
  byte *pbVar8;
  byte *pbVar9;
  int iVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  
  pbVar5 = (byte *)ScratchAllocator::allocate_raw(allocator,length,0x10);
  if (length != 0) {
    uVar6 = 0;
    pbVar8 = pbVar5;
    do {
      cVar1 = *data;
      iVar13 = (int)cVar1;
      if (cVar1 == '\0') {
        return pbVar5;
      }
      cVar2 = data[1];
      iVar14 = (int)cVar2;
      if (cVar2 == '\0') {
        return pbVar5;
      }
      cVar3 = data[2];
      iVar10 = (int)cVar3;
      if (cVar3 == '\0') {
        return pbVar5;
      }
      cVar4 = data[3];
      if (cVar4 == '\0') {
        return pbVar5;
      }
      if ((byte)(cVar1 + 0xbfU) < 0x1a) {
        iVar13 = iVar13 + -0x41;
      }
      else if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        iVar13 = iVar13 + -0x47;
      }
      else if ((byte)(cVar1 - 0x30U) < 10) {
        iVar13 = iVar13 + 4;
      }
      else {
        iVar13 = 0x3f;
        if (cVar1 != '/') {
          iVar13 = 0;
        }
        if (cVar1 == '+') {
          iVar13 = 0x3e;
        }
      }
      if ((byte)(cVar2 + 0xbfU) < 0x1a) {
        iVar14 = iVar14 + -0x41;
      }
      else if ((byte)(cVar2 + 0x9fU) < 0x1a) {
        iVar14 = iVar14 + -0x47;
      }
      else if ((byte)(cVar2 - 0x30U) < 10) {
        iVar14 = iVar14 + 4;
      }
      else {
        iVar14 = 0x3f;
        if (cVar2 != '/') {
          iVar14 = 0;
        }
        if (cVar2 == '+') {
          iVar14 = 0x3e;
        }
      }
      if ((byte)(cVar3 + 0xbfU) < 0x1a) {
        iVar10 = iVar10 + -0x41;
      }
      else if ((byte)(cVar3 + 0x9fU) < 0x1a) {
        iVar10 = iVar10 + -0x47;
      }
      else if ((byte)(cVar3 - 0x30U) < 10) {
        iVar10 = iVar10 + 4;
      }
      else {
        iVar10 = 0x3f;
        if (cVar3 != '/') {
          iVar10 = 0;
        }
        if (cVar3 == '+') {
          iVar10 = 0x3e;
        }
      }
      iVar14 = iVar14 * 0x1000 + iVar13 * 0x40000;
      uVar15 = iVar10 << 6;
      iVar13 = -0x41;
      bVar12 = (byte)((uint)iVar14 >> 0x10);
      bVar7 = (byte)((uint)iVar14 >> 8);
      if ((((byte)(cVar4 + 0xbfU) < 0x1a) || (iVar13 = -0x47, (byte)(cVar4 + 0x9fU) < 0x1a)) ||
         (iVar13 = 4, (byte)(cVar4 - 0x30U) < 10)) {
        uVar16 = uVar15 | iVar13 + cVar4;
        bVar7 = (byte)(uVar16 >> 8) | bVar7;
LAB_0011d73c:
        *pbVar8 = bVar12;
        pbVar8[1] = bVar7;
        lVar11 = 3;
        pbVar9 = pbVar8 + 2;
        bVar7 = (byte)uVar16;
      }
      else {
        uVar16 = 0x3f;
        if (cVar4 != '/') {
          uVar16 = 0;
        }
        if (cVar4 == '+') {
          uVar16 = 0x3e;
        }
        if (cVar4 == '=' && cVar3 == '=') {
          lVar11 = 1;
          pbVar9 = pbVar8;
          bVar7 = bVar12;
        }
        else {
          uVar16 = uVar15 | uVar16;
          bVar7 = (byte)(uVar15 >> 8) | bVar7;
          if (cVar4 != '=') goto LAB_0011d73c;
          pbVar9 = pbVar8 + 1;
          *pbVar8 = bVar12;
          lVar11 = 2;
        }
      }
      pbVar8 = pbVar8 + lVar11;
      *pbVar9 = bVar7;
      uVar6 = uVar6 + lVar11;
      data = data + 4;
    } while (uVar6 < length);
  }
  return pbVar5;
}

Assistant:

static uint8_t *decode_base64(ScratchAllocator &allocator, const char *data, size_t length)
{
	auto *buf = static_cast<uint8_t *>(allocator.allocate_raw(length, 16));
	auto *ptr = buf;

	const auto base64_index = [](char c) -> uint32_t {
		if (c >= 'A' && c <= 'Z')
			return uint32_t(c - 'A');
		else if (c >= 'a' && c <= 'z')
			return uint32_t(c - 'a') + 26;
		else if (c >= '0' && c <= '9')
			return uint32_t(c - '0') + 52;
		else if (c == '+')
			return 62;
		else if (c == '/')
			return 63;
		else
			return 0;
	};

	for (uint64_t i = 0; i < length; )
	{
		char c0 = *data++;
		if (c0 == '\0')
			break;
		char c1 = *data++;
		if (c1 == '\0')
			break;
		char c2 = *data++;
		if (c2 == '\0')
			break;
		char c3 = *data++;
		if (c3 == '\0')
			break;

		uint32_t values =
				(base64_index(c0) << 18) |
				(base64_index(c1) << 12) |
				(base64_index(c2) << 6) |
				(base64_index(c3) << 0);

		unsigned outbytes = 3;
		if (c2 == '=' && c3 == '=')
		{
			outbytes = 1;
			*ptr++ = uint8_t(values >> 16);
		}
		else if (c3 == '=')
		{
			outbytes = 2;
			*ptr++ = uint8_t(values >> 16);
			*ptr++ = uint8_t(values >> 8);
		}
		else
		{
			*ptr++ = uint8_t(values >> 16);
			*ptr++ = uint8_t(values >> 8);
			*ptr++ = uint8_t(values >> 0);
		}

		i += outbytes;
	}

	return buf;
}